

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minmax_test.cc
# Opt level: O2

void __thiscall
(anonymous_namespace)::MinMaxTest_CompareReference_Test::~MinMaxTest_CompareReference_Test
          (MinMaxTest_CompareReference_Test *this)

{
  anon_unknown.dwarf_1afbd7e::MinMaxTest_CompareReference_Test::~MinMaxTest_CompareReference_Test
            ((MinMaxTest_CompareReference_Test *)(this + -0x10));
  return;
}

Assistant:

TEST_P(MinMaxTest, CompareReference) {
  uint8_t a[64], b[64];
  for (int j = 0; j < 64; j++) {
    a[j] = rnd_.Rand8();
    b[j] = rnd_.Rand8();
  }

  int min_ref, max_ref, min, max;
  reference_minmax(a, 8, b, 8, &min_ref, &max_ref);
  API_REGISTER_STATE_CHECK(mm_func_(a, 8, b, 8, &min, &max));
  EXPECT_EQ(max_ref, max);
  EXPECT_EQ(min_ref, min);
}